

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

Error __thiscall
asmjit::v1_14::BaseBuilder::embedConstPool(BaseBuilder *this,Label *label,ConstPool *pool)

{
  bool bVar1;
  Error EVar2;
  EmbedDataNode **in_RDX;
  size_t in_RSI;
  BaseEmitter *in_RDI;
  Error _err_2;
  EmbedDataNode *node;
  Error _err_1;
  Error _err;
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  uint in_stack_ffffffffffffff88;
  ConstPool *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  size_t itemCount;
  BaseEmitter *data;
  EmbedDataNode **ppEVar3;
  BaseBuilder *in_stack_ffffffffffffffe0;
  TypeId typeId;
  
  EVar2 = (Error)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  if (in_RDI->_code == (CodeHolder *)0x0) {
    EVar2 = DebugUtils::errored(5);
  }
  else {
    itemCount = in_RSI;
    data = in_RDI;
    bVar1 = BaseEmitter::isLabelValid(in_RDI,*(uint32_t *)(in_RSI + 4));
    if (bVar1) {
      ppEVar3 = in_RDX;
      EVar2 = (*in_RDI->_vptr_BaseEmitter[9])(in_RDI,1,(ulong)in_RDX[0x1f] & 0xffffffff);
      typeId = (TypeId)((ulong)ppEVar3 >> 0x38);
      if (((EVar2 == 0) && (EVar2 = (*in_RDI->_vptr_BaseEmitter[6])(in_RDI,in_RSI), EVar2 == 0)) &&
         (EVar2 = newEmbedDataNode(in_stack_ffffffffffffffe0,in_RDX,typeId,data,itemCount,
                                   CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8)),
         EVar2 == 0)) {
        ConstPool::fill(in_stack_ffffffffffffff90,(void *)(ulong)in_stack_ffffffffffffff88);
        addNode((BaseBuilder *)CONCAT44(EVar2,in_stack_ffffffffffffff88),(BaseNode *)in_RDI);
        EVar2 = 0;
      }
    }
    else {
      DebugUtils::errored(0xc);
      EVar2 = BaseEmitter::reportError(in_RDI,EVar2,in_stack_ffffffffffffff70);
    }
  }
  return EVar2;
}

Assistant:

Error BaseBuilder::embedConstPool(const Label& label, const ConstPool& pool) {
  if (ASMJIT_UNLIKELY(!_code))
    return DebugUtils::errored(kErrorNotInitialized);

  if (!isLabelValid(label))
    return reportError(DebugUtils::errored(kErrorInvalidLabel));

  ASMJIT_PROPAGATE(align(AlignMode::kData, uint32_t(pool.alignment())));
  ASMJIT_PROPAGATE(bind(label));

  EmbedDataNode* node;
  ASMJIT_PROPAGATE(newEmbedDataNode(&node, TypeId::kUInt8, nullptr, pool.size()));
  ASMJIT_ASSUME(node != nullptr);

  pool.fill(node->data());
  addNode(node);
  return kErrorOk;
}